

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void ft_glyphslot_preset_bitmap(FT_GlyphSlot slot,FT_Render_Mode mode,FT_Vector *origin)

{
  short sVar1;
  FT_Vector *pFVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  FT_Pos FVar10;
  long lVar11;
  uchar uVar12;
  long lVar13;
  FT_Vector *pFVar14;
  ulong local_38;
  ulong local_30;
  long local_28;
  long local_20;
  
  if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 1) != 0)) {
    return;
  }
  if (origin == (FT_Vector *)0x0) {
    local_20 = 0;
    local_28 = 0;
  }
  else {
    local_28 = origin->x;
    local_20 = origin->y;
  }
  sVar1 = (slot->outline).n_points;
  if ((long)sVar1 == 0) {
    FVar10 = 0;
    lVar7 = 0;
    lVar11 = 0;
    lVar13 = 0;
  }
  else {
    pFVar2 = (slot->outline).points;
    lVar7 = pFVar2->x;
    FVar10 = pFVar2->y;
    lVar11 = FVar10;
    lVar13 = lVar7;
    if (1 < sVar1) {
      pFVar14 = pFVar2 + 1;
      do {
        lVar5 = pFVar14->x;
        if (lVar5 < lVar7) {
          lVar7 = lVar5;
        }
        lVar3 = pFVar14->y;
        if (lVar13 < lVar5) {
          lVar13 = lVar5;
        }
        if (lVar3 < FVar10) {
          FVar10 = lVar3;
        }
        if (lVar11 < lVar3) {
          lVar11 = lVar3;
        }
        pFVar14 = pFVar14 + 1;
      } while (pFVar14 < pFVar2 + sVar1);
    }
  }
  local_38 = lVar7 + local_28;
  local_30 = FVar10 + local_20;
  local_28 = local_28 + lVar13;
  local_20 = local_20 + lVar11;
  if (mode == FT_RENDER_MODE_LCD_V) {
    ft_lcd_padding((FT_Pos *)&local_30,&local_20,slot);
    uVar12 = '\x06';
  }
  else if (mode == FT_RENDER_MODE_LCD) {
    ft_lcd_padding((FT_Pos *)&local_38,&local_28,slot);
    uVar12 = '\x05';
  }
  else {
    uVar12 = '\x02';
    if (mode == FT_RENDER_MODE_MONO) {
      lVar5 = local_28 + 0x3f;
      if (0x3f < lVar13 - lVar7) {
        lVar5 = local_28 + 0x20;
        local_38 = local_38 + 0x20;
      }
      local_38 = local_38 & 0xffffffffffffffc0;
      uVar4 = local_20 + 0x3f;
      if (0x3f < lVar11 - FVar10) {
        uVar4 = local_20 + 0x20;
        local_30 = local_30 + 0x20;
      }
      uVar6 = lVar5 - local_38 >> 6;
      uVar8 = (uint)(uVar4 - (local_30 & 0xffffffffffffffc0) >> 6);
      uVar9 = (uint)(uVar6 + 0xf >> 3) & 0xfffffffe;
      uVar12 = '\x01';
      goto LAB_00132d47;
    }
  }
  local_38 = local_38 & 0xffffffffffffffc0;
  uVar4 = local_20 + 0x3f;
  uVar6 = (local_28 - local_38) + 0x3f >> 6;
  uVar9 = (uint)uVar6;
  uVar8 = (uint)(uVar4 - (local_30 & 0xffffffffffffffc0) >> 6);
  if (uVar12 == '\x06') {
    uVar8 = uVar8 * 3;
    uVar12 = '\x06';
  }
  else if (uVar12 == '\x05') {
    uVar6 = uVar6 * 3;
    uVar9 = uVar9 * 3 + 3 & 0xfffffffc;
    uVar12 = '\x05';
  }
LAB_00132d47:
  slot->bitmap_left = (FT_Int)(local_38 >> 6);
  slot->bitmap_top = (FT_Int)(uVar4 >> 6);
  (slot->bitmap).pixel_mode = uVar12;
  (slot->bitmap).num_grays = 0x100;
  (slot->bitmap).width = (uint)uVar6;
  (slot->bitmap).rows = uVar8;
  (slot->bitmap).pitch = uVar9;
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_preset_bitmap( FT_GlyphSlot      slot,
                              FT_Render_Mode    mode,
                              const FT_Vector*  origin )
  {
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;

    FT_Pixel_Mode  pixel_mode;

    FT_BBox  cbox;
    FT_Pos   x_shift = 0;
    FT_Pos   y_shift = 0;
    FT_Pos   x_left, y_top;
    FT_Pos   width, height, pitch;


    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
      return;

    if ( origin )
    {
      x_shift = origin->x;
      y_shift = origin->y;
    }

    /* compute the control box, and grid-fit it, */
    /* taking into account the origin shift      */
    FT_Outline_Get_CBox( outline, &cbox );

    cbox.xMin += x_shift;
    cbox.yMin += y_shift;
    cbox.xMax += x_shift;
    cbox.yMax += y_shift;

    switch ( mode )
    {
    case FT_RENDER_MODE_MONO:
      pixel_mode = FT_PIXEL_MODE_MONO;
#if 1
      /* undocumented but confirmed: bbox values get rounded    */
      /* unless the rounded box can collapse for a narrow glyph */
      if ( cbox.xMax - cbox.xMin < 64 )
      {
        cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
        cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      }
      else
      {
        cbox.xMin = FT_PIX_ROUND_LONG( cbox.xMin );
        cbox.xMax = FT_PIX_ROUND_LONG( cbox.xMax );
      }

      if ( cbox.yMax - cbox.yMin < 64 )
      {
        cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
        cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
      }
      else
      {
        cbox.yMin = FT_PIX_ROUND_LONG( cbox.yMin );
        cbox.yMax = FT_PIX_ROUND_LONG( cbox.yMax );
      }
#else
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
#endif
      break;

    case FT_RENDER_MODE_LCD:
      pixel_mode = FT_PIXEL_MODE_LCD;
      ft_lcd_padding( &cbox.xMin, &cbox.xMax, slot );
      goto Round;

    case FT_RENDER_MODE_LCD_V:
      pixel_mode = FT_PIXEL_MODE_LCD_V;
      ft_lcd_padding( &cbox.yMin, &cbox.yMax, slot );
      goto Round;

    case FT_RENDER_MODE_NORMAL:
    case FT_RENDER_MODE_LIGHT:
    default:
      pixel_mode = FT_PIXEL_MODE_GRAY;
    Round:
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
    }

    x_shift = SUB_LONG( x_shift, cbox.xMin );
    y_shift = SUB_LONG( y_shift, cbox.yMin );

    x_left = cbox.xMin >> 6;
    y_top  = cbox.yMax >> 6;

    width  = ( (FT_ULong)cbox.xMax - (FT_ULong)cbox.xMin ) >> 6;
    height = ( (FT_ULong)cbox.yMax - (FT_ULong)cbox.yMin ) >> 6;

    switch ( pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      pitch = ( ( width + 15 ) >> 4 ) << 1;
      break;

    case FT_PIXEL_MODE_LCD:
      width *= 3;
      pitch  = FT_PAD_CEIL( width, 4 );
      break;

    case FT_PIXEL_MODE_LCD_V:
      height *= 3;
      /* fall through */

    case FT_PIXEL_MODE_GRAY:
    default:
      pitch = width;
    }

    slot->bitmap_left = (FT_Int)x_left;
    slot->bitmap_top  = (FT_Int)y_top;

    bitmap->pixel_mode = (unsigned char)pixel_mode;
    bitmap->num_grays  = 256;
    bitmap->width      = (unsigned int)width;
    bitmap->rows       = (unsigned int)height;
    bitmap->pitch      = pitch;
  }